

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O2

void ImTui_ImplText_RenderDrawData(ImDrawData *drawData,TScreen *screen)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  ImU32 col;
  ImDrawList *pIVar13;
  ImDrawCmd *pIVar14;
  unsigned_short *puVar15;
  ImDrawVert *pIVar16;
  TCell *pTVar17;
  undefined1 auVar18 [16];
  TColor col_00;
  byte bVar19;
  undefined4 in_EAX;
  int iVar20;
  ImGuiIO *pIVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint i;
  uint uVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  int iVar29;
  int iVar31;
  undefined1 auVar30 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ImVec2 local_118;
  float local_d8;
  float fStack_d4;
  float local_c8;
  float fStack_c4;
  undefined1 auVar36 [16];
  
  iVar29 = (int)((drawData->FramebufferScale).x * (drawData->DisplaySize).x);
  iVar31 = (int)((drawData->FramebufferScale).y * (drawData->DisplaySize).y);
  auVar28._0_4_ = -(uint)(0 < iVar29);
  auVar28._4_4_ = -(uint)(0 < iVar29);
  auVar28._8_4_ = -(uint)(0 < iVar31);
  auVar28._12_4_ = -(uint)(0 < iVar31);
  iVar20 = movmskpd(in_EAX,auVar28);
  if (iVar20 == 3) {
    pIVar21 = ImGui::GetIO();
    fVar32 = (pIVar21->DisplaySize).x;
    pIVar21 = ImGui::GetIO();
    ImTui::TScreen::resize(screen,(int)fVar32,(int)(pIVar21->DisplaySize).y);
    ImTui::TScreen::clear(screen);
    IVar5 = drawData->DisplayPos;
    IVar6 = drawData->FramebufferScale;
    for (lVar22 = 0; lVar22 < drawData->CmdListsCount; lVar22 = lVar22 + 1) {
      pIVar13 = drawData->CmdLists[lVar22];
      for (lVar23 = 0; lVar23 < (pIVar13->CmdBuffer).Size; lVar23 = lVar23 + 1) {
        pIVar14 = (pIVar13->CmdBuffer).Data;
        uVar3 = pIVar14[lVar23].ClipRect.x;
        uVar7 = pIVar14[lVar23].ClipRect.y;
        local_c8 = IVar5.x;
        fStack_c4 = IVar5.y;
        local_d8 = IVar6.x;
        fStack_d4 = IVar6.y;
        fVar32 = ((float)uVar3 - local_c8) * local_d8;
        fVar33 = ((float)uVar7 - fStack_c4) * fStack_d4;
        if ((fVar32 < (float)iVar29) && (fVar33 < (float)iVar31)) {
          uVar4 = pIVar14[lVar23].ClipRect.z;
          uVar8 = pIVar14[lVar23].ClipRect.w;
          local_d8 = ((float)uVar4 - local_c8) * local_d8;
          fStack_d4 = ((float)uVar8 - fStack_c4) * fStack_d4;
          if ((0.0 <= local_d8) && (0.0 <= fStack_d4)) {
            fVar26 = -10000.0;
            uVar37 = 0;
            uVar38 = 0;
            uVar39 = 0;
            uVar41 = 0;
            uVar42 = 0;
            fVar27 = fVar26;
            uVar40 = uVar37;
            for (uVar25 = 0; uVar25 < pIVar14[lVar23].ElemCount; uVar25 = uVar25 + 3) {
              uVar12 = pIVar14[lVar23].IdxOffset;
              iVar20 = uVar12 + uVar25;
              puVar15 = (pIVar13->IdxBuffer).Data;
              pIVar16 = (pIVar13->VtxBuffer).Data;
              uVar9 = puVar15[iVar20];
              uVar10 = puVar15[(int)(uVar12 + 1 + uVar25)];
              uVar11 = puVar15[(int)(uVar12 + uVar25 + 2)];
              auVar44._8_8_ = 0;
              auVar44._0_4_ = pIVar16[uVar9].pos.x;
              auVar44._4_4_ = pIVar16[uVar9].pos.y;
              auVar48._8_8_ = 0;
              auVar48._0_4_ = pIVar16[uVar10].pos.x;
              auVar48._4_4_ = pIVar16[uVar10].pos.y;
              auVar30._8_8_ = 0;
              auVar30._0_4_ = pIVar16[uVar11].pos.x;
              auVar30._4_4_ = pIVar16[uVar11].pos.y;
              auVar18._4_4_ = fStack_d4 + -1.0;
              auVar18._0_4_ = local_d8 + -1.0;
              auVar18._8_8_ = 0;
              auVar28 = minps(auVar44,auVar18);
              auVar43._4_4_ = fVar33;
              auVar43._0_4_ = fVar32;
              auVar43._8_8_ = 0;
              auVar44 = maxps(auVar43,auVar28);
              auVar28 = minps(auVar48,auVar18);
              auVar47._4_4_ = fVar33;
              auVar47._0_4_ = fVar32;
              auVar47._8_8_ = 0;
              auVar48 = maxps(auVar47,auVar28);
              auVar28 = minps(auVar30,auVar18);
              auVar35._4_4_ = fVar33;
              auVar35._0_4_ = fVar32;
              auVar35._8_8_ = 0;
              auVar28 = maxps(auVar35,auVar28);
              fVar34 = pIVar16[uVar9].uv.x;
              fVar1 = pIVar16[uVar10].uv.x;
              col = pIVar16[uVar9].col;
              if ((((fVar34 != fVar1) || (fVar2 = pIVar16[uVar11].uv.x, fVar34 != fVar2)) ||
                  (fVar1 != fVar2)) || (NAN(fVar1) || NAN(fVar2))) {
LAB_001171f7:
                auVar45._4_4_ = auVar44._4_4_ + auVar48._4_4_ + auVar28._4_4_;
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._4_4_;
                auVar45._12_4_ = auVar45._4_4_;
                auVar46._4_12_ = auVar45._4_12_;
                fVar34 = (pIVar16[puVar15[iVar20 + 3]].pos.x +
                          auVar44._0_4_ + auVar48._0_4_ + auVar28._0_4_ +
                          pIVar16[puVar15[iVar20 + 4]].pos.x + pIVar16[puVar15[iVar20 + 5]].pos.x) /
                         6.0;
                auVar36 = ZEXT416((uint)fVar34);
                auVar46._0_4_ =
                     (auVar45._4_4_ + pIVar16[puVar15[iVar20 + 3]].pos.y +
                      pIVar16[puVar15[iVar20 + 4]].pos.y + pIVar16[puVar15[iVar20 + 5]].pos.y) / 6.0
                     + 0.5;
                if ((ABS(auVar46._0_4_ - fVar26) < 0.5) && (ABS(fVar34 - fVar27) < 0.5)) {
                  auVar36._4_4_ = uVar40;
                  auVar36._0_4_ = fVar27 + 1.0;
                  auVar36._8_4_ = uVar41;
                  auVar36._12_4_ = uVar42;
                  auVar46._4_4_ = uVar37;
                  auVar46._0_4_ = fVar26;
                  auVar46._8_4_ = uVar38;
                  auVar46._12_4_ = uVar39;
                }
                fVar27 = auVar36._0_4_ + 1.0;
                fVar34 = (float)(int)fVar27;
                fVar26 = auVar46._0_4_;
                if ((fVar32 <= fVar34) && (fVar34 < local_d8)) {
                  fVar34 = (float)(int)(fVar26 + 0.0);
                  if ((fVar33 <= fVar34) && (fVar34 < fStack_d4)) {
                    pTVar17 = screen->data;
                    lVar24 = (long)((int)(fVar26 + 0.0) * screen->nx + (int)fVar27);
                    pTVar17[lVar24] =
                         col >> 0x18 | (uint)*(byte *)((long)pTVar17 + lVar24 * 4 + 3) << 0x18;
                    bVar19 = rgbToAnsi256(col,false);
                    auVar36 = ZEXT416((uint)auVar36._0_4_);
                    pTVar17[lVar24] = pTVar17[lVar24] | (uint)bVar19 << 0x10;
                  }
                }
                uVar25 = uVar25 + 3;
                uVar37 = auVar46._4_4_;
                uVar38 = auVar46._8_4_;
                uVar39 = auVar46._12_4_;
                fVar27 = auVar36._0_4_;
                uVar40 = auVar36._4_4_;
                uVar41 = auVar36._8_4_;
                uVar42 = auVar36._12_4_;
              }
              else {
                fVar34 = pIVar16[uVar9].uv.y;
                fVar1 = pIVar16[uVar10].uv.y;
                if (((fVar34 != fVar1) || (fVar2 = pIVar16[uVar11].uv.y, fVar34 != fVar2)) ||
                   ((fVar1 != fVar2 || (NAN(fVar1) || NAN(fVar2))))) goto LAB_001171f7;
                col_00 = rgbToAnsi256(col,true);
                local_118 = auVar44._0_8_;
                drawTriangle(local_118,auVar48._0_8_,auVar28._0_8_,col_00,screen);
                uVar40 = 0;
                uVar41 = 0;
                uVar42 = 0;
                uVar37 = 0;
                uVar38 = 0;
                uVar39 = 0;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImTui_ImplText_RenderDrawData(ImDrawData * drawData, ImTui::TScreen * screen) {
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(drawData->DisplaySize.x * drawData->FramebufferScale.x);
    int fb_height = (int)(drawData->DisplaySize.y * drawData->FramebufferScale.y);

    if (fb_width <= 0 || fb_height <= 0) {
        return;
    }

    screen->resize(ImGui::GetIO().DisplaySize.x, ImGui::GetIO().DisplaySize.y);
    screen->clear();

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = drawData->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = drawData->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < drawData->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = drawData->CmdLists[n];

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            {
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    float lastCharX = -10000.0f;
                    float lastCharY = -10000.0f;

                    for (unsigned int i = 0; i < pcmd->ElemCount; i += 3) {
                        int vidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 0];
                        int vidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 1];
                        int vidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 2];

                        auto pos0 = cmd_list->VtxBuffer[vidx0].pos;
                        auto pos1 = cmd_list->VtxBuffer[vidx1].pos;
                        auto pos2 = cmd_list->VtxBuffer[vidx2].pos;

                        pos0.x = std::max(std::min(float(clip_rect.z - 1), pos0.x), clip_rect.x);
                        pos1.x = std::max(std::min(float(clip_rect.z - 1), pos1.x), clip_rect.x);
                        pos2.x = std::max(std::min(float(clip_rect.z - 1), pos2.x), clip_rect.x);
                        pos0.y = std::max(std::min(float(clip_rect.w - 1), pos0.y), clip_rect.y);
                        pos1.y = std::max(std::min(float(clip_rect.w - 1), pos1.y), clip_rect.y);
                        pos2.y = std::max(std::min(float(clip_rect.w - 1), pos2.y), clip_rect.y);

                        auto uv0 = cmd_list->VtxBuffer[vidx0].uv;
                        auto uv1 = cmd_list->VtxBuffer[vidx1].uv;
                        auto uv2 = cmd_list->VtxBuffer[vidx2].uv;

                        auto col0 = cmd_list->VtxBuffer[vidx0].col;
                        //auto col1 = cmd_list->VtxBuffer[vidx1].col;
                        //auto col2 = cmd_list->VtxBuffer[vidx2].col;

                        if (uv0.x != uv1.x || uv0.x != uv2.x || uv1.x != uv2.x ||
                            uv0.y != uv1.y || uv0.y != uv2.y || uv1.y != uv2.y) {
                            int vvidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 3];
                            int vvidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 4];
                            int vvidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 5];

                            auto ppos0 = cmd_list->VtxBuffer[vvidx0].pos;
                            auto ppos1 = cmd_list->VtxBuffer[vvidx1].pos;
                            auto ppos2 = cmd_list->VtxBuffer[vvidx2].pos;

                            float x = ((pos0.x + pos1.x + pos2.x + ppos0.x + ppos1.x + ppos2.x)/6.0f);
                            float y = ((pos0.y + pos1.y + pos2.y + ppos0.y + ppos1.y + ppos2.y)/6.0f) + 0.5f;

                            if (std::fabs(y - lastCharY) < 0.5f && std::fabs(x - lastCharX) < 0.5f) {
                                x = lastCharX + 1.0f;
                                y = lastCharY;
                            }

                            lastCharX = x;
                            lastCharY = y;

                            int xx = (x) + 1;
                            int yy = (y) + 0;
                            if (xx < clip_rect.x || xx >= clip_rect.z || yy < clip_rect.y || yy >= clip_rect.w) {
                            } else {
                                auto & cell = screen->data[yy*screen->nx + xx];
                                cell &= 0xFF000000;
                                cell |= (col0 & 0xff000000) >> 24;
                                cell |= ((ImTui::TCell)(rgbToAnsi256(col0, false)) << 16);
                            }
                            i += 3;
                        } else {
                            drawTriangle(pos0, pos1, pos2, rgbToAnsi256(col0, true), screen);
                        }
                    }
                }
            }
        }
    }

}